

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O3

void af_glyph_hints_align_strong_points(AF_GlyphHints hints,AF_Dimension dim)

{
  short sVar1;
  uint uVar2;
  AF_Edge_conflict pAVar3;
  long lVar4;
  long lVar5;
  AF_Edge_conflict pAVar6;
  long lVar7;
  long lVar8;
  AF_Point_conflict point;
  AF_Point_conflict pAVar9;
  AF_Point_conflict pAVar10;
  bool bVar11;
  
  uVar2 = hints->axis[dim].num_edges;
  lVar8 = (long)(int)uVar2;
  if (0 < hints->num_points && 0 < lVar8) {
    pAVar9 = hints->points;
    pAVar10 = pAVar9 + hints->num_points;
    pAVar3 = hints->axis[dim].edges;
    bVar11 = dim != AF_DIMENSION_HORZ;
    do {
      if (((ushort)bVar11 * 4 + 0x14 & pAVar9->flags) == 0) {
        sVar1 = (&pAVar9->fx)[dim == AF_DIMENSION_VERT];
        if (pAVar3->fpos < sVar1) {
          if (sVar1 < pAVar3[lVar8 + -1].fpos) {
            if (uVar2 < 9) {
              lVar4 = 0;
              pAVar6 = pAVar3;
              do {
                lVar5 = lVar4;
                if (sVar1 <= pAVar6->fpos) break;
                lVar4 = lVar4 + 1;
                pAVar6 = pAVar6 + 1;
                lVar5 = lVar8;
              } while (lVar8 != lVar4);
              if (pAVar3[lVar5].fpos == sVar1) {
                lVar5 = pAVar3[lVar5].pos;
                goto LAB_00181f19;
              }
            }
            else {
              lVar5 = 0;
              lVar4 = lVar8;
              do {
                lVar7 = lVar4 + lVar5 >> 1;
                if (pAVar3[lVar7].fpos <= sVar1) {
                  if (sVar1 <= pAVar3[lVar7].fpos) {
                    lVar5 = pAVar3[lVar7].pos;
                    goto LAB_00181f19;
                  }
                  lVar5 = lVar7 + 1;
                  lVar7 = lVar4;
                }
                lVar4 = lVar7;
              } while (lVar5 < lVar7);
            }
            pAVar6 = pAVar3 + lVar5;
            lVar5 = pAVar3[lVar5 + -1].scale;
            if (lVar5 == 0) {
              lVar5 = FT_DivFix(pAVar6->pos - pAVar6[-1].pos,
                                (long)pAVar6->fpos - (long)pAVar6[-1].fpos);
              pAVar6[-1].scale = lVar5;
            }
            lVar5 = (long)(int)lVar5 * ((long)sVar1 - (long)pAVar6[-1].fpos);
            lVar5 = (lVar5 + (lVar5 >> 0x3f) + 0x8000 >> 0x10) + pAVar6[-1].pos;
          }
          else {
            lVar5 = ((&pAVar9->ox)[dim == AF_DIMENSION_VERT] + pAVar3[lVar8 + -1].pos) -
                    pAVar3[lVar8 + -1].opos;
          }
        }
        else {
          lVar5 = ((&pAVar9->ox)[dim == AF_DIMENSION_VERT] + pAVar3->pos) - pAVar3->opos;
        }
LAB_00181f19:
        (&pAVar9->x)[bVar11] = lVar5;
        pAVar9->flags = pAVar9->flags | (ushort)bVar11 * 4 + 4;
      }
      pAVar9 = pAVar9 + 1;
    } while (pAVar9 < pAVar10);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_align_strong_points( AF_GlyphHints  hints,
                                      AF_Dimension   dim )
  {
    AF_Point      points      = hints->points;
    AF_Point      point_limit = points + hints->num_points;
    AF_AxisHints  axis        = &hints->axis[dim];
    AF_Edge       edges       = axis->edges;
    AF_Edge       edge_limit  = edges + axis->num_edges;
    FT_UInt       touch_flag;


    if ( dim == AF_DIMENSION_HORZ )
      touch_flag = AF_FLAG_TOUCH_X;
    else
      touch_flag  = AF_FLAG_TOUCH_Y;

    if ( edges < edge_limit )
    {
      AF_Point  point;
      AF_Edge   edge;


      for ( point = points; point < point_limit; point++ )
      {
        FT_Pos  u, ou, fu;  /* point position */
        FT_Pos  delta;


        if ( point->flags & touch_flag )
          continue;

        /* if this point is candidate to weak interpolation, we       */
        /* interpolate it after all strong points have been processed */

        if ( ( point->flags & AF_FLAG_WEAK_INTERPOLATION ) )
          continue;

        if ( dim == AF_DIMENSION_VERT )
        {
          u  = point->fy;
          ou = point->oy;
        }
        else
        {
          u  = point->fx;
          ou = point->ox;
        }

        fu = u;

        /* is the point before the first edge? */
        edge  = edges;
        delta = edge->fpos - u;
        if ( delta >= 0 )
        {
          u = edge->pos - ( edge->opos - ou );
          goto Store_Point;
        }

        /* is the point after the last edge? */
        edge  = edge_limit - 1;
        delta = u - edge->fpos;
        if ( delta >= 0 )
        {
          u = edge->pos + ( ou - edge->opos );
          goto Store_Point;
        }

        {
          FT_PtrDist  min, max, mid;
          FT_Pos      fpos;


          /* find enclosing edges */
          min = 0;
          max = edge_limit - edges;

#if 1
          /* for a small number of edges, a linear search is better */
          if ( max <= 8 )
          {
            FT_PtrDist  nn;


            for ( nn = 0; nn < max; nn++ )
              if ( edges[nn].fpos >= u )
                break;

            if ( edges[nn].fpos == u )
            {
              u = edges[nn].pos;
              goto Store_Point;
            }
            min = nn;
          }
          else
#endif
          while ( min < max )
          {
            mid  = ( max + min ) >> 1;
            edge = edges + mid;
            fpos = edge->fpos;

            if ( u < fpos )
              max = mid;
            else if ( u > fpos )
              min = mid + 1;
            else
            {
              /* we are on the edge */
              u = edge->pos;
              goto Store_Point;
            }
          }

          /* point is not on an edge */
          {
            AF_Edge  before = edges + min - 1;
            AF_Edge  after  = edges + min + 0;


            /* assert( before && after && before != after ) */
            if ( before->scale == 0 )
              before->scale = FT_DivFix( after->pos - before->pos,
                                         after->fpos - before->fpos );

            u = before->pos + FT_MulFix( fu - before->fpos,
                                         before->scale );
          }
        }

      Store_Point:
        /* save the point position */
        if ( dim == AF_DIMENSION_HORZ )
          point->x = u;
        else
          point->y = u;

        point->flags |= touch_flag;
      }
    }
  }